

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

mraa_result_t mraa_find_uart_bus_pci(char *pci_dev_path,char **dev_name)

{
  mraa_boolean_t mVar1;
  int *piVar2;
  char *pcVar3;
  int local_103c;
  dirent **ppdStack_1038;
  int n;
  dirent **namelist;
  char local_1028 [4];
  int max_allowable_len;
  char path [4096];
  char **dev_name_local;
  char *pci_dev_path_local;
  
  namelist._4_4_ = 0x10;
  snprintf(local_1028,0xfff,"%s",pci_dev_path);
  mVar1 = mraa_file_exist(local_1028);
  if (mVar1 == 0) {
    pci_dev_path_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
  }
  else {
    local_103c = scandir(local_1028,&stack0xffffffffffffefc8,(__selector *)0x0,alphasort);
    if (local_103c < 1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      syslog(3,"Failed to find expected UART bus: %s",pcVar3);
      pci_dev_path_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      pcVar3 = (char *)malloc(0x10);
      *dev_name = pcVar3;
      snprintf(*dev_name,0x10,"/dev/%s",ppdStack_1038[local_103c + -1]->d_name);
      while (local_103c != 0) {
        free(ppdStack_1038[local_103c + -1]);
        local_103c = local_103c + -1;
      }
      free(ppdStack_1038);
      syslog(6,"UART device: %s selected for initialization",*dev_name);
      pci_dev_path_local._4_4_ = MRAA_SUCCESS;
    }
  }
  return pci_dev_path_local._4_4_;
}

Assistant:

mraa_result_t
mraa_find_uart_bus_pci(const char* pci_dev_path, char** dev_name)
{
    char path[PATH_MAX];
    const int max_allowable_len = 16;
    snprintf(path, PATH_MAX - 1, "%s", pci_dev_path);
    if (!mraa_file_exist(path)) {
        return MRAA_ERROR_INVALID_PARAMETER;
    }

    struct dirent** namelist;
    int n = scandir(path, &namelist, NULL, alphasort);
    if (n <= 0) {
        syslog(LOG_ERR, "Failed to find expected UART bus: %s", strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    *dev_name = (char*) malloc(sizeof(char) * max_allowable_len);

    snprintf(*dev_name, max_allowable_len, "/dev/%s", namelist[n - 1]->d_name);
    while (n--) {
        free(namelist[n]);
    }
    free(namelist);
    syslog(LOG_INFO, "UART device: %s selected for initialization", *dev_name);
    return MRAA_SUCCESS;
}